

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

void InitSituation(Situation *situation)

{
  undefined4 *in_RDI;
  size_type in_stack_00000028;
  vector<Movement,_std::allocator<Movement>_> *in_stack_00000030;
  
  memset(in_RDI + 1,0,0x100);
  memset(in_RDI + 0x41,0,0x30);
  memset(in_RDI + 0x55,0,0x20);
  memset(in_RDI + 0x4d,0,0x20);
  *in_RDI = 0;
  in_RDI[0x5d] = 0;
  in_RDI[0x5e] = 0;
  std::vector<Movement,_std::allocator<Movement>_>::clear
            ((vector<Movement,_std::allocator<Movement>_> *)0x10e724);
  std::vector<Movement,_std::allocator<Movement>_>::reserve(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void InitSituation(Situation & situation){
    // 清空棋子棋盘数组
    memset(situation.current_board, 0, sizeof(UINT8) * 256);
    memset(situation.current_pieces, 0, sizeof(UINT8) * 48);
    // 清空位行位列
    memset(situation.bit_col, 0, sizeof(UINT16) * 16);
    memset(situation.bit_row, 0, sizeof(UINT16) * 16);
    // 初始化局面价值 玩家
    situation.current_player = RED;
    situation.value[RED] = 0;
    situation.value[BLACK] = 0;
    // 清空着法栈
    situation.moves_stack.clear();
    situation.moves_stack.reserve(300);
}